

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralNull * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1)

{
  value_type this_00;
  value_type local_28;
  
  this_00 = (value_type)operator_new(0x80);
  LiteralNull::LiteralNull((LiteralNull *)this_00,args,args_1);
  local_28 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,&local_28);
  return (LiteralNull *)this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }